

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O3

void init_encode_rd_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
                      SIMPLE_MOTION_DATA_TREE *sms_root,RD_STATS *rd_cost,int mi_row,int mi_col,
                      int gather_tpl_data)

{
  byte bVar1;
  byte right_shift;
  byte bVar2;
  BLOCK_SIZE BVar3;
  DELTAQ_MODE DVar4;
  uint8_t uVar5;
  AV1_PRIMARY *pAVar6;
  SequenceHeader *pSVar7;
  TplDepFrame *pTVar8;
  long lVar9;
  ulong uVar10;
  MB_MODE_INFO *pMVar11;
  MB_RD_RECORD *pMVar12;
  int8_t iVar13;
  int idx;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  bool bVar31;
  int64_t tpl_pred_error [7];
  int64_t inter_cost [7];
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  if ((((((cpi->sf).part_sf.simple_motion_search_split != 0) ||
        ((cpi->sf).part_sf.simple_motion_search_prune_rect != 0)) ||
       ((cpi->sf).part_sf.simple_motion_search_early_term_none != 0)) ||
      ((cpi->sf).part_sf.ml_early_term_after_part_split_level != 0)) &&
     (((cpi->common).current_frame.frame_type & 0xfd) != 0)) {
    av1_init_simple_motion_search_mvs_for_sb
              (cpi,&tile_data->tile_info,&td->mb,sms_root,mi_row,mi_col);
  }
  pAVar6 = cpi->ppi;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (pAVar6->lap_enabled == 0)) &&
     (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) goto LAB_001a39aa;
  bVar1 = cpi->gf_frame_index;
  right_shift = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
  (td->mb).tpl_keep_ref_frame[0] = '\0';
  (td->mb).tpl_keep_ref_frame[1] = '\0';
  (td->mb).tpl_keep_ref_frame[2] = '\0';
  (td->mb).tpl_keep_ref_frame[3] = '\0';
  (td->mb).tpl_keep_ref_frame[4] = '\0';
  (td->mb).tpl_keep_ref_frame[5] = '\0';
  (td->mb).tpl_keep_ref_frame[6] = '\0';
  (td->mb).tpl_keep_ref_frame[7] = '\0';
  iVar14 = av1_tpl_stats_ready(&pAVar6->tpl_data,(uint)bVar1);
  if (((iVar14 != 0) && (bVar2 = (pAVar6->gf_group).update_type[cpi->gf_frame_index], bVar2 < 4)) &&
     ((bVar2 != 1 && ((cpi->oxcf).q_cfg.aq_mode == '\0')))) {
    if ((cpi->ppi->gf_group).update_type[bVar1] == '\x04') {
      builtin_memcpy((td->mb).tpl_keep_ref_frame,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
    }
    else {
      pTVar8 = (pAVar6->tpl_data).tpl_frame;
      lVar20 = *(long *)((long)pTVar8->ref_map_index + ((ulong)((uint)bVar1 * 0x60) - 0x18));
      iVar14 = *(int *)((long)pTVar8->ref_map_index + (ulong)((uint)bVar1 * 0x60) + 0x20);
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_38 = 0;
      BVar3 = ((cpi->common).seq_params)->sb_size;
      iVar17 = (cpi->common).mi_params.mi_rows;
      iVar21 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar3] + mi_row;
      if (iVar17 <= (int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [BVar3] + mi_row)) {
        iVar21 = iVar17;
      }
      uVar15 = (cpi->common).superres_upscaled_width + 7 >> 2 & 0xfffffffe;
      bVar1 = (cpi->common).superres_scale_denominator;
      iVar27 = (uint)bVar1 * mi_col;
      iVar17 = iVar27 + 4;
      iVar27 = iVar27 + 0xb;
      if (-1 < iVar17) {
        iVar27 = iVar17;
      }
      iVar24 = ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [BVar3] + mi_col) * (uint)bVar1;
      iVar17 = iVar24 + 4;
      iVar24 = iVar24 + 0xb;
      if (-1 < iVar17) {
        iVar24 = iVar17;
      }
      uVar18 = iVar24 >> 3;
      if ((int)uVar15 <= iVar24 >> 3) {
        uVar18 = uVar15;
      }
      iVar24 = (uint)bVar1 << (right_shift & 0x1f);
      iVar17 = iVar24 + 4;
      iVar24 = iVar24 + 0xb;
      if (-1 < iVar17) {
        iVar24 = iVar17;
      }
      local_b0 = rd_cost;
      if (mi_row < iVar21) {
        iVar17 = iVar27 >> 3;
        iVar30 = mi_row;
        do {
          for (; iVar17 < (int)uVar18; iVar17 = iVar17 + (iVar24 >> 3)) {
            iVar16 = av1_tpl_ptr_pos(iVar30,iVar17,iVar14,right_shift);
            local_88 = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            local_78 = 0;
            lVar19 = (long)iVar16 * 200;
            lVar29 = *(long *)(lVar20 + 0x50 + lVar19);
            uVar22 = 0;
            uVar25 = 0;
            lVar28 = lVar29;
            do {
              lVar9 = *(long *)(lVar20 + 0x58 + lVar19 + uVar22 * 8);
              uVar22 = uVar22 + 1;
              if (lVar9 != 0 && lVar9 < lVar28) {
                uVar25 = uVar22 & 0xffffffff;
                lVar28 = lVar9;
              }
            } while (uVar22 != 6);
            *(long *)(local_a8 + (long)(int)uVar25 * 8) =
                 *(long *)(lVar19 + lVar20 + 0x50 + (long)(int)uVar25 * 8) - lVar29;
            lVar29 = 1;
            do {
              lVar28 = *(long *)(local_a8 + lVar29 * 8 + 8);
              lVar19 = *(long *)(local_68 + lVar29 * 8 + 8);
              *(long *)(local_68 + lVar29 * 8) =
                   *(long *)(local_68 + lVar29 * 8) + *(long *)(local_a8 + lVar29 * 8);
              *(long *)(local_68 + lVar29 * 8 + 8) = lVar19 + lVar28;
              lVar29 = lVar29 + 2;
            } while (lVar29 != 7);
          }
          iVar30 = iVar30 + (1 << (right_shift & 0x1f));
          iVar17 = iVar27 >> 3;
        } while (iVar30 < iVar21);
      }
      lVar29 = 1;
      lVar20 = 0;
      do {
        lVar19 = lVar20 + 1;
        *(int *)(local_a8 + lVar20 * 4) = (int)lVar19;
        lVar28 = lVar29;
        if (lVar20 != 0) {
          do {
            uVar22 = (ulong)((int)lVar28 - 2);
            iVar14 = *(int *)(local_a8 + uVar22 * 4);
            if (*(long *)(local_68 + (long)*(int *)(local_a8 + lVar28 * 4 + -4) * 8) <
                *(long *)(local_68 + (long)iVar14 * 8)) {
              *(int *)(local_a8 + uVar22 * 4) = *(int *)(local_a8 + lVar28 * 4 + -4);
              *(int *)(local_a8 + lVar28 * 4 + -4) = iVar14;
            }
            lVar28 = lVar28 + -1;
          } while (1 < lVar28);
        }
        lVar29 = lVar29 + 1;
        lVar20 = lVar19;
      } while (lVar19 != 6);
      (td->mb).tpl_keep_ref_frame[0] = '\x01';
      (td->mb).tpl_keep_ref_frame[1] = '\x01';
      uVar22 = 0;
      bVar31 = false;
      do {
        lVar20 = (long)*(int *)(local_a8 + uVar22 * 4);
        (td->mb).tpl_keep_ref_frame[lVar20 + 1] = '\x01';
        if (2 < uVar22) {
          if (!bVar31) {
            uVar25 = *(ulong *)(local_68 + lVar20 * 8);
            uVar23 = -uVar25;
            if (0 < (long)uVar25) {
              uVar23 = uVar25;
            }
            uVar10 = *(ulong *)(local_68 + (long)*(int *)(local_a8 + uVar22 * 4 + -4) * 8);
            uVar26 = -uVar10;
            if (0 < (long)uVar10) {
              uVar26 = uVar10;
            }
            if ((uVar25 != 0) && (bVar31 = false, uVar26 >> 3 <= uVar23)) goto LAB_001a36aa;
          }
          (td->mb).tpl_keep_ref_frame[lVar20 + 1] = '\0';
          bVar31 = true;
        }
LAB_001a36aa:
        uVar22 = uVar22 + 1;
        rd_cost = local_b0;
      } while (uVar22 != 6);
    }
  }
  (td->mb).sb_energy_level = 0;
  (td->mb).part_search_info.cnn_output_valid = 0;
  if ((gather_tpl_data == 0) || ((cpi->common).delta_q_info.delta_q_present_flag == 0))
  goto LAB_001a39aa;
  pSVar7 = (cpi->common).seq_params;
  bVar31 = pSVar7->monochrome == '\0';
  BVar3 = pSVar7->sb_size;
  av1_setup_src_planes(&td->mb,cpi->source,mi_row,mi_col,bVar31 + 1 + (uint)bVar31,BVar3);
  iVar14 = (cpi->common).delta_q_info.delta_q_res;
  iVar17 = (cpi->common).quant_params.base_qindex;
  if ((cpi->use_ducky_encode == 0) || ((cpi->ducky_encode_info).frame_info.qp_mode != '\x01')) {
    DVar4 = (cpi->oxcf).q_cfg.deltaq_mode;
    switch(DVar4) {
    case '\x01':
      if ((cpi->oxcf).algo_cfg.enable_tpl_model == true) {
        iVar17 = av1_get_q_for_deltaq_objective(cpi,td,(int64_t *)0x0,BVar3,mi_row,mi_col);
      }
      else if ((cpi->oxcf).q_cfg.enable_hdr_deltaq == true) goto LAB_001a378b;
      break;
    case '\x02':
      iVar17 = av1_block_wavelet_energy_level(cpi,&td->mb,BVar3);
      (td->mb).sb_energy_level = iVar17;
      iVar17 = av1_compute_q_from_energy_level_deltaq_mode(cpi,iVar17);
      break;
    case '\x03':
      iVar17 = av1_get_sbq_perceptual_ai(cpi,BVar3,mi_row,mi_col);
      break;
    case '\x04':
      iVar17 = av1_get_sbq_user_rating_based(cpi,mi_row,mi_col);
      break;
    default:
      if ((cpi->oxcf).q_cfg.enable_hdr_deltaq == false) {
        if (DVar4 == '\x06') {
          iVar17 = av1_get_sbq_variance_boost(cpi,&td->mb);
        }
      }
      else {
LAB_001a378b:
        iVar17 = av1_get_q_for_hdr(cpi,&td->mb,BVar3,mi_row,mi_col);
      }
    }
  }
  else {
    bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
    iVar17 = (cpi->ducky_encode_info).frame_info.superblock_encode_qindex
             [(~(-1 << (bVar1 & 0x1f)) + (cpi->common).mi_params.mi_cols >> (bVar1 & 0x1f)) *
              (mi_row >> (bVar1 & 0x1f)) + (mi_col >> (bVar1 & 0x1f))];
  }
  (td->mb).rdmult_cur_qindex = iVar17;
  iVar14 = av1_adjust_q_from_delta_q_res(iVar14,(td->mb).e_mbd.current_base_qindex,iVar17);
  iVar17 = iVar14 - (cpi->common).quant_params.base_qindex;
  (td->mb).delta_qindex = iVar17;
  (td->mb).rdmult_delta_qindex = iVar17;
  av1_set_offsets(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,BVar3);
  pMVar11 = *(td->mb).e_mbd.mi;
  pMVar11->current_qindex = iVar14;
  av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&pMVar11->field_0xa7 & 7,0);
  iVar14 = (td->mb).delta_qindex;
  td->deltaq_used = td->deltaq_used | (uint)(iVar14 != 0);
  if ((cpi->oxcf).tool_cfg.enable_deltalf_mode == true) {
    iVar17 = (cpi->common).delta_q_info.delta_lf_res;
    iVar21 = iVar14 + 3;
    if (-1 < iVar14) {
      iVar21 = iVar14;
    }
    uVar18 = iVar17 / 2 + (iVar21 >> 2) & -iVar17;
    uVar15 = 0x3f;
    if ((int)uVar18 < 0x3f) {
      uVar15 = uVar18;
    }
    iVar13 = -0x3f;
    if (-0x3f < (int)uVar15) {
      iVar13 = (int8_t)uVar15;
    }
    pSVar7 = (cpi->common).seq_params;
    iVar14 = pSVar7->mib_size;
    iVar17 = (cpi->common).mi_params.mi_rows;
    iVar21 = iVar17 - mi_row;
    if (iVar14 < iVar17 - mi_row) {
      iVar21 = iVar14;
    }
    if (0 < iVar21) {
      uVar5 = pSVar7->monochrome;
      iVar21 = (cpi->common).mi_params.mi_cols;
      iVar24 = 0;
      iVar27 = mi_row;
      do {
        iVar30 = iVar21 - mi_col;
        if (iVar14 < iVar21 - mi_col) {
          iVar30 = iVar14;
        }
        if (0 < iVar30) {
          iVar17 = 0;
          lVar20 = (long)mi_col;
          do {
            iVar21 = (cpi->common).mi_params.mi_stride;
            (cpi->common).mi_params.mi_alloc[iVar21 * (iVar24 + mi_row) + iVar17 + mi_col].
            delta_lf_from_base = iVar13;
            lVar28 = (iVar21 * iVar27 + lVar20) * 0xb0 + 0xa3;
            lVar29 = (ulong)(uVar5 == '\0') * 2 + 2;
            do {
              *(int8_t *)((long)((cpi->common).mi_params.mi_alloc)->mv + lVar28 + -8) = iVar13;
              lVar28 = lVar28 + 1;
              lVar29 = lVar29 + -1;
            } while (lVar29 != 0);
            iVar17 = iVar17 + 1;
            iVar21 = (cpi->common).mi_params.mi_cols;
            iVar30 = iVar21 - mi_col;
            if (iVar14 < iVar21 - mi_col) {
              iVar30 = iVar14;
            }
            lVar20 = lVar20 + 1;
          } while (iVar17 < iVar30);
          iVar17 = (cpi->common).mi_params.mi_rows;
        }
        iVar24 = iVar24 + 1;
        iVar30 = iVar17 - mi_row;
        if (iVar14 < iVar17 - mi_row) {
          iVar30 = iVar14;
        }
        iVar27 = iVar27 + 1;
      } while (iVar24 < iVar30);
    }
  }
  av1_tpl_rdmult_setup_sb(cpi,&td->mb,BVar3,mi_row,mi_col);
LAB_001a39aa:
  (td->mb).reuse_inter_pred = false;
  (td->mb).txfm_search_params.mode_eval_type = 0;
  pMVar12 = (td->mb).txfm_search_info.mb_rd_record;
  if (pMVar12 != (MB_RD_RECORD *)0x0) {
    pMVar12->index_start = 0;
    pMVar12->num = 0;
  }
  memset((td->mb).picked_ref_frames_mask,0,0x1000);
  rd_cost->rate = 0x7fffffff;
  rd_cost->zero_rate = 0;
  rd_cost->dist = 0x7fffffffffffffff;
  rd_cost->rdcost = 0x7fffffffffffffff;
  rd_cost->sse = 0x7fffffffffffffff;
  rd_cost->skip_txfm = '\0';
  return;
}

Assistant:

static inline void init_encode_rd_sb(AV1_COMP *cpi, ThreadData *td,
                                     const TileDataEnc *tile_data,
                                     SIMPLE_MOTION_DATA_TREE *sms_root,
                                     RD_STATS *rd_cost, int mi_row, int mi_col,
                                     int gather_tpl_data) {
  const AV1_COMMON *cm = &cpi->common;
  const TileInfo *tile_info = &tile_data->tile_info;
  MACROBLOCK *x = &td->mb;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int use_simple_motion_search =
      (sf->part_sf.simple_motion_search_split ||
       sf->part_sf.simple_motion_search_prune_rect ||
       sf->part_sf.simple_motion_search_early_term_none ||
       sf->part_sf.ml_early_term_after_part_split_level) &&
      !frame_is_intra_only(cm);
  if (use_simple_motion_search) {
    av1_init_simple_motion_search_mvs_for_sb(cpi, tile_info, x, sms_root,
                                             mi_row, mi_col);
  }

#if !CONFIG_REALTIME_ONLY
  if (!(has_no_stats_stage(cpi) && cpi->oxcf.mode == REALTIME &&
        cpi->oxcf.gf_cfg.lag_in_frames == 0)) {
    init_ref_frame_space(cpi, td, mi_row, mi_col);
    x->sb_energy_level = 0;
    x->part_search_info.cnn_output_valid = 0;
    if (gather_tpl_data) {
      if (cm->delta_q_info.delta_q_present_flag) {
        const int num_planes = av1_num_planes(cm);
        const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
        setup_delta_q(cpi, td, x, tile_info, mi_row, mi_col, num_planes);
        av1_tpl_rdmult_setup_sb(cpi, x, sb_size, mi_row, mi_col);
      }

      // TODO(jingning): revisit this function.
      if (cpi->oxcf.algo_cfg.enable_tpl_model && (0)) {
        adjust_rdmult_tpl_model(cpi, x, mi_row, mi_col);
      }
    }
  }
#else
  (void)tile_info;
  (void)mi_row;
  (void)mi_col;
  (void)gather_tpl_data;
#endif

  x->reuse_inter_pred = false;
  x->txfm_search_params.mode_eval_type = DEFAULT_EVAL;
  reset_mb_rd_record(x->txfm_search_info.mb_rd_record);
  av1_zero(x->picked_ref_frames_mask);
  av1_invalid_rd_stats(rd_cost);
}